

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::HttpMethod> kj::tryParseHttpMethod(StringPtr name)

{
  Tag TVar1;
  NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *other;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *pOVar2;
  HttpMethod *t;
  HttpConnectMethod *pHVar3;
  size_t in_RCX;
  char *in_RDX;
  NullableValue<kj::HttpMethod> this;
  StringPtr name_00;
  HttpConnectMethod *_kj_switch_done_1;
  HttpConnectMethod *m_1;
  HttpMethod *_kj_switch_done;
  HttpMethod *m;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *_kj_switch_subject;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *method;
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> local_50;
  undefined1 local_38 [8];
  NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> _method439;
  StringPtr name_local;
  
  _method439.field_1.value.field_1 =
       (anon_union_8_1_a8a2e026_for_OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_2)
       name.content.size_;
  this = (NullableValue<kj::HttpMethod>)name.content.ptr;
  name_00.content.size_ = in_RCX;
  name_00.content.ptr = in_RDX;
  tryParseHttpMethodAllowingConnect(&local_50,(kj *)_method439.field_1.value.field_1,name_00);
  other = _::readMaybe<kj::OneOf<kj::HttpMethod,kj::HttpConnectMethod>>(&local_50);
  _::NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::NullableValue
            ((NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)local_38,other);
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::~Maybe(&local_50);
  pOVar2 = _::NullableValue::operator_cast_to_OneOf_((NullableValue *)local_38);
  if (pOVar2 == (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x0) {
    Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this);
LAB_00616dc8:
    _::NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::~NullableValue
              ((NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)local_38);
    return (Maybe<kj::HttpMethod>)this;
  }
  pOVar2 = _::NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_>::operator*
                     ((NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)local_38);
  pOVar2 = OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::_switchSubject(pOVar2);
  TVar1 = OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::which(pOVar2);
  if (TVar1 == _variant0) {
    t = OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::get<kj::HttpMethod>(pOVar2);
    if (t != (HttpMethod *)0x0) {
      Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this,t);
      goto LAB_00616dc8;
    }
  }
  else if ((TVar1 == _variant1) &&
          (pHVar3 = OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::get<kj::HttpConnectMethod>(pOVar2)
          , pHVar3 != (HttpConnectMethod *)0x0)) {
    Maybe<kj::HttpMethod>::Maybe((Maybe<kj::HttpMethod> *)this);
    goto LAB_00616dc8;
  }
  _::unreachable();
}

Assistant:

kj::Maybe<HttpMethod> tryParseHttpMethod(kj::StringPtr name) {
  KJ_IF_SOME(method, tryParseHttpMethodAllowingConnect(name)) {
    KJ_SWITCH_ONEOF(method) {
      KJ_CASE_ONEOF(m, HttpMethod) { return m; }
      KJ_CASE_ONEOF(m, HttpConnectMethod) { return kj::none; }
    }
    KJ_UNREACHABLE;
  } else {
    return kj::none;
  }